

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O3

int ON::IsOpenNURBSFile(char *utf8pathname)

{
  int iVar1;
  FILE *fp;
  
  if (((utf8pathname != (char *)0x0) && (*utf8pathname != '\0')) &&
     (fp = OpenFile(utf8pathname,"rb"), fp != (FILE *)0x0)) {
    iVar1 = IsOpenNURBSFile(fp);
    CloseFile(fp);
    return iVar1;
  }
  return 0;
}

Assistant:

int ON::IsOpenNURBSFile( const char* utf8pathname )
{
  int version = 0;
  if ( 0 != utf8pathname && 0 != utf8pathname[0] )
  {
    FILE* fp = ON::OpenFile(utf8pathname,"rb");
    if ( 0 != fp )
    {
      version = ON::IsOpenNURBSFile(fp);
      ON::CloseFile(fp);
    }
  }
  return version;
}